

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_Spawn(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret
                   ,int numret)

{
  AActor *val;
  PClassActor *pPVar1;
  char *pcVar2;
  PClassActor *type;
  int iVar3;
  DVector3 local_40;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_0042e70d;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0042e6fd:
    pcVar2 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_0042e70d;
  }
  type = (PClassActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_0042e5b0;
LAB_0042e5c4:
    pPVar1 = type;
    if (type != (PClassActor *)AActor::RegistrationInfo.MyClass) {
      do {
        pPVar1 = (PClassActor *)(pPVar1->super_PClass).ParentClass;
        if (pPVar1 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
      } while (pPVar1 != (PClassActor *)0x0);
      if (pPVar1 == (PClassActor *)0x0) {
        pcVar2 = "type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))";
LAB_0042e70d:
        __assert_fail(pcVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1246,
                      "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
    }
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_0042e6fd;
LAB_0042e5b0:
    NullParam("\"type\"");
    type = (PClassActor *)(param->field_0).field_1.a;
    if (type != (PClassActor *)0x0) goto LAB_0042e5c4;
    type = (PClassActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar2 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_0042e79b:
      __assert_fail(pcVar2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1247,
                    "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_40.X = (double)param[1].field_0.field_1.a;
LAB_0042e64d:
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar2 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_0042e7ba:
      __assert_fail(pcVar2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1248,
                    "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_40.Y = (double)param[2].field_0.field_1.a;
LAB_0042e65e:
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar2 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_0042e74b:
      __assert_fail(pcVar2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1249,
                    "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_40.Z = (double)param[3].field_0.field_1.a;
  }
  else {
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar2 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_0042e79b;
    }
    local_40.X = (double)param[1].field_0.field_1.a;
    if (numparam < 3) {
      param = defaultparam->Array;
      goto LAB_0042e64d;
    }
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar2 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_0042e7ba;
    }
    local_40.Y = (double)param[2].field_0.field_1.a;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_0042e65e;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar2 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_0042e74b;
    }
    local_40.Z = (double)param[3].field_0.field_1.a;
    if (4 < (uint)numparam) {
      if (param[4].field_0.field_3.Type != '\0') {
        pcVar2 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_0042e72c;
      }
      goto LAB_0042e67a;
    }
    param = defaultparam->Array;
  }
  if (param[4].field_0.field_3.Type != '\0') {
    pcVar2 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_0042e72c:
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x124a,"int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
LAB_0042e67a:
  iVar3 = 0;
  val = AActor::StaticSpawn(type,&local_40,param[4].field_0.i,false);
  if (0 < numret) {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x124b,
                    "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar3 = 1;
    VMReturn::SetPointer(ret,val,1);
  }
  return iVar3;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Spawn)
{
	PARAM_PROLOGUE;
	PARAM_CLASS_NOT_NULL(type, AActor);
	PARAM_FLOAT_DEF(x);
	PARAM_FLOAT_DEF(y);
	PARAM_FLOAT_DEF(z);
	PARAM_INT_DEF(flags);
	ACTION_RETURN_OBJECT(AActor::StaticSpawn(type, DVector3(x, y, z), replace_t(flags)));
}